

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

int Cbs2_ManPropagate(Cbs2_Man_t *p,int Level)

{
  int iVar1;
  Gia_Obj_t *pVar;
  bool bVar2;
  int local_2c;
  int hClause;
  int iLit;
  int iVar;
  int k;
  int i;
  int Level_local;
  Cbs2_Man_t *p_local;
  
  do {
    iVar = (p->pProp).iHead;
    while( true ) {
      bVar2 = false;
      if (iVar < (p->pProp).iTail) {
        local_2c = (p->pProp).pData[iVar];
        bVar2 = local_2c != 0;
      }
      if (!bVar2) break;
      iVar1 = Abc_Lit2Var(local_2c);
      iVar1 = Cbs2_ManPropagateOne(p,iVar1,Level);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar = iVar + 1;
    }
    (p->pProp).iHead = (p->pProp).iTail;
    iLit = (p->pJust).iHead;
    iVar = (p->pJust).iHead;
    while( true ) {
      bVar2 = false;
      if (iVar < (p->pJust).iTail) {
        hClause = (p->pJust).pData[iVar];
        bVar2 = hClause != 0;
      }
      if (!bVar2) break;
      pVar = Gia_ManObj(p->pAig,hClause);
      iVar1 = Cbs2_VarIsJust(p,pVar,hClause);
      if (iVar1 == 0) {
        iVar1 = Cbs2_ManPropagateTwo(p,hClause,Level);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      else {
        (p->pJust).pData[iLit] = hClause;
        iLit = iLit + 1;
      }
      iVar = iVar + 1;
    }
    if (iLit == (p->pJust).iTail) {
      return 0;
    }
    (p->pJust).iTail = iLit;
  } while( true );
}

Assistant:

int Cbs2_ManPropagate( Cbs2_Man_t * p, int Level )
{
    while ( 1 )
    {
        int i, k, iVar, iLit, hClause;
        Cbs2_QueForEachEntry( p->pProp, iLit, i )
        {
            if ( (hClause = Cbs2_ManPropagateOne( p, Abc_Lit2Var(iLit), Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs2_QueForEachEntry( p->pJust, iVar, i )
        {
            if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
                p->pJust.pData[k++] = iVar;
            else if ( (hClause = Cbs2_ManPropagateTwo( p, iVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}